

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_UINT32 opj_j2k_get_max_coc_size(opj_j2k_t *p_j2k)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  uint uVar5;
  OPJ_UINT32 p_tile_no;
  OPJ_UINT32 p_comp_no;
  
  OVar1 = (p_j2k->m_cp).th;
  OVar2 = (p_j2k->m_cp).tw;
  OVar3 = p_j2k->m_private_image->numcomps;
  uVar5 = 0;
  for (p_tile_no = 0; p_tile_no != OVar1 * OVar2; p_tile_no = p_tile_no + 1) {
    for (p_comp_no = 0; OVar3 != p_comp_no; p_comp_no = p_comp_no + 1) {
      OVar4 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_tile_no,p_comp_no);
      if (uVar5 <= OVar4) {
        uVar5 = OVar4;
      }
    }
  }
  return uVar5 + 6;
}

Assistant:

static OPJ_UINT32 opj_j2k_get_max_coc_size(opj_j2k_t *p_j2k)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_nb_comp;
    OPJ_UINT32 l_nb_tiles;
    OPJ_UINT32 l_max = 0;

    /* preconditions */

    l_nb_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th ;
    l_nb_comp = p_j2k->m_private_image->numcomps;

    for (i = 0; i < l_nb_tiles; ++i) {
        for (j = 0; j < l_nb_comp; ++j) {
            l_max = opj_uint_max(l_max, opj_j2k_get_SPCod_SPCoc_size(p_j2k, i, j));
        }
    }

    return 6 + l_max;
}